

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqc.c
# Opt level: O0

void opj_mqc_restart_init_enc(opj_mqc_t *mqc)

{
  opj_mqc_t *mqc_local;
  
  mqc->a = 0x8000;
  mqc->c = 0;
  mqc->ct = 0xc;
  mqc->bp = mqc->bp + -1;
  if (mqc->bp < mqc->start + -1) {
    __assert_fail("mqc->bp >= mqc->start - 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/mqc.c"
                  ,0x1c7,"void opj_mqc_restart_init_enc(opj_mqc_t *)");
  }
  if (*mqc->bp != 0xff) {
    if (*mqc->bp == 0xff) {
      mqc->ct = 0xd;
    }
    return;
  }
  __assert_fail("*mqc->bp != 0xff",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/mqc.c"
                ,0x1c8,"void opj_mqc_restart_init_enc(opj_mqc_t *)");
}

Assistant:

void opj_mqc_restart_init_enc(opj_mqc_t *mqc)
{
    /* <Re-init part> */

    /* As specified in Figure C.10 - Initialization of the encoder */
    /* (C.2.8 Initialization of the encoder (INITENC)) */
    mqc->a = 0x8000;
    mqc->c = 0;
    mqc->ct = 12;
    /* This function is normally called after at least one opj_mqc_flush() */
    /* which will have advance mqc->bp by at least 2 bytes beyond its */
    /* initial position */
    mqc->bp --;
    assert(mqc->bp >= mqc->start - 1);
    assert(*mqc->bp != 0xff);
    if (*mqc->bp == 0xff) {
        mqc->ct = 13;
    }
}